

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

bool __thiscall ON_WindowsBitmap::ReadCompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ON_WindowsBITMAPINFO *pOVar6;
  uint uVar7;
  char *sFormat;
  int line_number;
  uint uVar8;
  long lVar9;
  bool bFailedCRC;
  int i;
  short s;
  size_t sizeof_buffer;
  bool local_69;
  uint local_68;
  unsigned_short local_62;
  ulong local_60;
  uint local_54;
  size_t local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  Internal_Destroy(this);
  local_69 = false;
  local_68 = 0;
  local_62 = 0;
  bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
  if ((((bVar4) &&
       (bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68), uVar7 = local_68, bVar4)) &&
      (bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68), uVar8 = local_68, bVar4)) &&
     (((bVar4 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_62), uVar1 = local_62, bVar4 &&
       (bVar4 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_62), uVar2 = local_62, bVar4))
      && (bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68), bVar4)))) {
    local_34 = local_68;
    bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
    if (bVar4) {
      local_60 = (ulong)local_68;
      bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
      if (bVar4) {
        local_38 = local_68;
        bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
        if (bVar4) {
          local_3c = local_68;
          bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
          if (bVar4) {
            local_54 = local_68;
            bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
            if (bVar4) {
              local_44 = (uint)uVar2;
              uVar5 = local_54;
              if (local_54 == 0) {
                if (local_44 == 1) {
                  uVar5 = 2;
                }
                else if (local_44 == 8) {
                  uVar5 = 0x100;
                }
                else if (local_44 == 4) {
                  uVar5 = 0x10;
                }
                else {
                  uVar5 = 0;
                }
              }
              local_40 = local_68;
              pOVar6 = (ON_WindowsBITMAPINFO *)onmalloc(local_60 + (long)(int)uVar5 * 4 + 0x2c);
              uVar3 = local_60;
              if (pOVar6 == (ON_WindowsBITMAPINFO *)0x0) {
                this->m_bmi = (ON_WindowsBITMAPINFO *)0x0;
              }
              else {
                pOVar6->bmiColors[0].rgbBlue = '\0';
                pOVar6->bmiColors[0].rgbGreen = '\0';
                pOVar6->bmiColors[0].rgbRed = '\0';
                pOVar6->bmiColors[0].rgbReserved = '\0';
                this->m_bmi = pOVar6;
                this->m_bFreeBMI = 1;
                (pOVar6->bmiHeader).biWidth = uVar7;
                (pOVar6->bmiHeader).biHeight = uVar8;
                (pOVar6->bmiHeader).biPlanes = uVar1;
                (pOVar6->bmiHeader).biBitCount = uVar2;
                (pOVar6->bmiHeader).biCompression = local_34;
                uVar8 = (uint)local_60;
                (pOVar6->bmiHeader).biSizeImage = uVar8;
                (pOVar6->bmiHeader).biXPelsPerMeter = local_38;
                (pOVar6->bmiHeader).biYPelsPerMeter = local_3c;
                (pOVar6->bmiHeader).biClrUsed = local_54;
                (pOVar6->bmiHeader).biClrImportant = local_40;
                (pOVar6->bmiHeader).biSize = 0x28;
                uVar7 = local_54;
                if (local_54 == 0) {
                  if (local_44 == 1) {
                    uVar7 = 2;
                  }
                  else if (local_44 == 8) {
                    uVar7 = 0x100;
                  }
                  else if (local_44 == 4) {
                    uVar7 = 0x10;
                  }
                  else {
                    uVar7 = 0;
                  }
                }
                lVar9 = (long)(int)uVar7;
                if (uVar8 != 0) {
                  this->m_bits = &pOVar6->bmiColors[lVar9].rgbBlue;
                }
                local_50 = 0;
                bVar4 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_50);
                if (bVar4) {
                  if (local_50 == lVar9 * 4 + uVar3 || local_50 == lVar9 * 4) {
                    bVar4 = ON_BinaryArchive::ReadCompressedBuffer
                                      (file,local_50,this->m_bmi->bmiColors,&local_69);
                    if (uVar8 == 0) {
                      return bVar4;
                    }
                    if (!bVar4) {
                      return bVar4;
                    }
                    if (local_50 != lVar9 * 4) {
                      return bVar4;
                    }
                    local_50 = 0;
                    bVar4 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_50);
                    if (!bVar4) {
                      return false;
                    }
                    if (local_50 == local_60) {
                      bVar4 = ON_BinaryArchive::ReadCompressedBuffer
                                        (file,local_60,this->m_bmi->bmiColors + lVar9,&local_69);
                      return bVar4;
                    }
                    sFormat = "ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n"
                    ;
                    line_number = 0x3b4;
                  }
                  else {
                    sFormat = "ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n";
                    line_number = 0x3bc;
                  }
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bitmap.cpp"
                             ,line_number,"",sFormat);
                  return false;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_WindowsBitmap::ReadCompressed( ON_BinaryArchive& file )
{
  Internal_Destroy();

  bool bFailedCRC = false;
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif
  memset(&bmiHeader,0,sizeof(bmiHeader));
  int i;
  short s;
  bool rc;

  for(;;)
  {
    i = 0;
    s = 0;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSize = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biWidth = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biHeight = i;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biPlanes = s;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biBitCount = s;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biCompression = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSizeImage = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biXPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biYPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrUsed = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrImportant = i;
    break;
  }


  if ( rc ) 
  {
    bmiHeader.biSize = sizeof(bmiHeader);
    const size_t sizeof_palette = ON_WindowsBitmapHelper_SizeofPalette(bmiHeader.biClrUsed, bmiHeader.biBitCount );
    const size_t sizeof_image   = bmiHeader.biSizeImage;
    m_bmi = ON_WindowsBitmapHelper_AllocBMI(sizeof_palette,sizeof_image);
    if ( !m_bmi )
    {
      rc = false;
    }
    else 
    {
      m_bFreeBMI = 1;
      m_bmi->bmiHeader = bmiHeader;
      m_bmi->bmiHeader.biSize = sizeof(m_bmi->bmiHeader);
      const int color_count = ON_WindowsBitmapHelper_PaletteColorCount(bmiHeader.biClrUsed, bmiHeader.biBitCount );
      if ( sizeof_image > 0 )
        m_bits = (unsigned char*)&m_bmi->bmiColors[color_count];
      size_t sizeof_buffer = 0;
      rc = file.ReadCompressedBufferSize( &sizeof_buffer );
      if (rc)
      {
        const size_t sizeof_colors = color_count*sizeof(*m_bmi->bmiColors);
        if (    sizeof_buffer == sizeof_colors
             || sizeof_buffer == sizeof_colors + sizeof_image
           ) 
        {
          // palette and image bits are compressed into one or two chunks
          rc = file.ReadCompressedBuffer( sizeof_buffer, m_bmi->bmiColors, &bFailedCRC );
          if ( rc && sizeof_image > 0 && sizeof_buffer == sizeof_colors )
          {
            // 28 July 2003
            //     Added support for reading non-contiguous bitmaps
            sizeof_buffer = 0;
            rc = file.ReadCompressedBufferSize( &sizeof_buffer );
            if (rc)
            {
              if ( sizeof_buffer == sizeof_image )
              {
                // image bits are compressed into a separatechunk
                rc = file.ReadCompressedBuffer( sizeof_buffer, &m_bmi->bmiColors[color_count], &bFailedCRC );
              }
              else
              {
                ON_ERROR("ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n");
                rc = false;
              }
            }
          }
        }
        else
        {
          ON_ERROR("ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n");
          rc = false;
        }
      }
    }
  }
  return rc;
}